

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adjointstepper.c
# Opt level: O0

SUNErrCode
SUNAdjointStepper_Create
          (SUNStepper_conflict fwd_sunstepper,int own_fwd,SUNStepper_conflict adj_sunstepper,
          int own_adj,suncountertype final_step_idx,sunrealtype tf,N_Vector sf,
          SUNAdjointCheckpointScheme checkpoint_scheme,SUNContext_conflict sunctx,
          SUNAdjointStepper *adj_stepper_ptr)

{
  undefined8 *puVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_XMM0_Qa;
  SUNAdjointStepper adj_stepper;
  SUNContext_conflict sunctx_local_scope_;
  
  puVar1 = (undefined8 *)malloc(0x50);
  puVar1[3] = in_RDI;
  *(undefined4 *)((long)puVar1 + 0x24) = in_ESI;
  puVar1[2] = in_RDX;
  *(undefined4 *)(puVar1 + 4) = in_ECX;
  puVar1[5] = sunctx_local_scope_;
  puVar1[9] = in_XMM0_Qa;
  puVar1[1] = in_R8;
  *puVar1 = 0;
  puVar1[6] = 0;
  puVar1[8] = sf;
  *(undefined8 **)tf = puVar1;
  return 0;
}

Assistant:

SUNErrCode SUNAdjointStepper_Create(
  SUNStepper fwd_sunstepper, sunbooleantype own_fwd, SUNStepper adj_sunstepper,
  sunbooleantype own_adj, suncountertype final_step_idx, sunrealtype tf,
  SUNDIALS_MAYBE_UNUSED N_Vector sf, SUNAdjointCheckpointScheme checkpoint_scheme,
  SUNContext sunctx, SUNAdjointStepper* adj_stepper_ptr)
{
  SUNFunctionBegin(sunctx);

  SUNAdjointStepper adj_stepper = NULL;
  adj_stepper = (SUNAdjointStepper)malloc(sizeof(*adj_stepper));
  SUNAssert(adj_stepper, SUN_ERR_MALLOC_FAIL);

  adj_stepper->fwd_sunstepper     = fwd_sunstepper;
  adj_stepper->own_fwd_sunstepper = own_fwd;
  adj_stepper->adj_sunstepper     = adj_sunstepper;
  adj_stepper->own_adj_sunstepper = own_adj;
  adj_stepper->checkpoint_scheme  = checkpoint_scheme;

  adj_stepper->tf             = tf;
  adj_stepper->final_step_idx = final_step_idx;

  adj_stepper->nrecompute = 0;

  adj_stepper->user_data = NULL;
  adj_stepper->sunctx    = sunctx;

  *adj_stepper_ptr = adj_stepper;

  return SUN_SUCCESS;
}